

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RecursiveDescentParser.cpp
# Opt level: O2

shared_ptr<MyCompiler::Condition> __thiscall
MyCompiler::RecursiveDescentParser::parse<MyCompiler::Condition>(RecursiveDescentParser *this)

{
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  long in_RSI;
  __shared_ptr<MyCompiler::Expression,_(__gnu_cxx::_Lock_policy)2> *this_00;
  shared_ptr<MyCompiler::Condition> sVar1;
  undefined1 local_20 [16];
  
  std::make_shared<MyCompiler::Condition>();
  if (*(int *)(in_RSI + 0x30) == 0x1f) {
    *(undefined4 *)(this->stream + 4) = 1;
    parse<MyCompiler::Expression>((RecursiveDescentParser *)local_20);
    this_00 = (__shared_ptr<MyCompiler::Expression,_(__gnu_cxx::_Lock_policy)2> *)
              (this->stream + 0x48);
  }
  else {
    *(undefined4 *)(this->stream + 4) = 0;
    parse<MyCompiler::Expression>((RecursiveDescentParser *)local_20);
    std::__shared_ptr<MyCompiler::Expression,_(__gnu_cxx::_Lock_policy)2>::operator=
              ((__shared_ptr<MyCompiler::Expression,_(__gnu_cxx::_Lock_policy)2> *)
               (this->stream + 0x48),
               (__shared_ptr<MyCompiler::Expression,_(__gnu_cxx::_Lock_policy)2> *)local_20);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_20 + 8));
    parse<MyCompiler::RelOp>((RecursiveDescentParser *)local_20);
    std::__shared_ptr<MyCompiler::RelOp,_(__gnu_cxx::_Lock_policy)2>::operator=
              ((__shared_ptr<MyCompiler::RelOp,_(__gnu_cxx::_Lock_policy)2> *)(this->stream + 0x58),
               (__shared_ptr<MyCompiler::RelOp,_(__gnu_cxx::_Lock_policy)2> *)local_20);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_20 + 8));
    parse<MyCompiler::Expression>((RecursiveDescentParser *)local_20);
    this_00 = (__shared_ptr<MyCompiler::Expression,_(__gnu_cxx::_Lock_policy)2> *)
              (this->stream + 0x68);
  }
  std::__shared_ptr<MyCompiler::Expression,_(__gnu_cxx::_Lock_policy)2>::operator=
            (this_00,(__shared_ptr<MyCompiler::Expression,_(__gnu_cxx::_Lock_policy)2> *)local_20);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_20 + 8));
  sVar1.super___shared_ptr<MyCompiler::Condition,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       extraout_RDX._M_pi;
  sVar1.super___shared_ptr<MyCompiler::Condition,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)this;
  return (shared_ptr<MyCompiler::Condition>)
         sVar1.super___shared_ptr<MyCompiler::Condition,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

std::shared_ptr<MyCompiler::Condition> MyCompiler::RecursiveDescentParser::parse()
{
    auto pResult = std::make_shared<Condition>();

    if (sym == SymbolType::ODD)
    {
        pResult->caseNum = 1;
        pResult->pExpression1 = parse<Expression>();
    }
    else
    {
        pResult->caseNum = 0;
        pResult->pExpression1 = parse<Expression>();
        pResult->pRelOp = parse<RelOp>();
        pResult->pExpression2 = parse<Expression>();
    }

    return pResult;
}